

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void HFilter16i_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  __m128i *in_RDI;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  undefined1 auVar21 [16];
  byte bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint8_t *b;
  __m128i tmp2;
  __m128i tmp1;
  __m128i mask;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  int k;
  uint8_t *local_378;
  __m128i *in_stack_fffffffffffffc90;
  __m128i *in_stack_fffffffffffffc98;
  __m128i *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  uint8_t *in_stack_fffffffffffffcb0;
  uint8_t *in_stack_fffffffffffffcb8;
  __m128i *in_stack_fffffffffffffcc0;
  __m128i *in_stack_fffffffffffffcc8;
  __m128i *in_stack_fffffffffffffcd0;
  __m128i *in_stack_fffffffffffffcd8;
  __m128i *in_stack_fffffffffffffce0;
  __m128i *in_stack_fffffffffffffce8;
  undefined8 uStack_310;
  int local_304;
  undefined1 in_stack_fffffffffffffd48 [16];
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  int stride_00;
  undefined4 uStack_1fc;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  byte bStack_24;
  byte bStack_23;
  byte bStack_22;
  byte bStack_21;
  byte bStack_20;
  byte bStack_1f;
  byte bStack_1e;
  byte bStack_1d;
  byte bStack_1c;
  byte bStack_1b;
  byte bStack_1a;
  byte bStack_19;
  byte bStack_14;
  byte bStack_13;
  byte bStack_12;
  byte bStack_11;
  byte bStack_10;
  byte bStack_f;
  byte bStack_e;
  byte bStack_d;
  byte bStack_c;
  byte bStack_b;
  byte bStack_a;
  byte bStack_9;
  
  Load16x4_SSE2(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0,
                in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffd48._8_8_)
  ;
  for (local_304 = 3; 0 < local_304; local_304 = local_304 + -1) {
    in_RDI = (__m128i *)((long)*in_RDI + 4);
    auVar20._8_8_ = in_stack_fffffffffffffcc0;
    auVar20._0_8_ = in_stack_fffffffffffffcb8;
    auVar19._8_8_ = in_stack_fffffffffffffcd0;
    auVar19._0_8_ = in_stack_fffffffffffffcc8;
    auVar34 = psubusb(auVar20,auVar19);
    auVar18._8_8_ = in_stack_fffffffffffffcd0;
    auVar18._0_8_ = in_stack_fffffffffffffcc8;
    auVar17._8_8_ = in_stack_fffffffffffffcc0;
    auVar17._0_8_ = in_stack_fffffffffffffcb8;
    auVar21 = psubusb(auVar18,auVar17);
    local_238 = auVar34._0_8_;
    uStack_230 = auVar34._8_8_;
    local_248 = auVar21._0_8_;
    uStack_240 = auVar21._8_8_;
    local_238 = local_238 | local_248;
    uStack_230 = uStack_230 | uStack_240;
    auVar16._8_8_ = in_stack_fffffffffffffce0;
    auVar16._0_8_ = in_stack_fffffffffffffcd8;
    auVar15._8_8_ = uStack_310;
    auVar15._0_8_ = in_stack_fffffffffffffce8;
    auVar34 = psubusb(auVar16,auVar15);
    auVar14._8_8_ = uStack_310;
    auVar14._0_8_ = in_stack_fffffffffffffce8;
    auVar13._8_8_ = in_stack_fffffffffffffce0;
    auVar13._0_8_ = in_stack_fffffffffffffcd8;
    auVar21 = psubusb(auVar14,auVar13);
    local_258 = auVar34._0_8_;
    uStack_250 = auVar34._8_8_;
    local_268 = auVar21._0_8_;
    uStack_260 = auVar21._8_8_;
    local_258 = local_258 | local_268;
    uStack_250 = uStack_250 | uStack_260;
    bStack_14 = (byte)(local_238 >> 0x20);
    bStack_13 = (byte)(local_238 >> 0x28);
    bStack_12 = (byte)(local_238 >> 0x30);
    bStack_11 = (byte)(local_238 >> 0x38);
    bStack_10 = (byte)uStack_230;
    bStack_f = (byte)(uStack_230 >> 8);
    bStack_e = (byte)(uStack_230 >> 0x10);
    bStack_d = (byte)(uStack_230 >> 0x18);
    bStack_c = (byte)(uStack_230 >> 0x20);
    bStack_b = (byte)(uStack_230 >> 0x28);
    bStack_a = (byte)(uStack_230 >> 0x30);
    bStack_9 = (byte)(uStack_230 >> 0x38);
    bStack_24 = (byte)(local_258 >> 0x20);
    bStack_23 = (byte)(local_258 >> 0x28);
    bStack_22 = (byte)(local_258 >> 0x30);
    bStack_21 = (byte)(local_258 >> 0x38);
    bStack_20 = (byte)uStack_250;
    bStack_1f = (byte)(uStack_250 >> 8);
    bStack_1e = (byte)(uStack_250 >> 0x10);
    bStack_1d = (byte)(uStack_250 >> 0x18);
    bStack_1c = (byte)(uStack_250 >> 0x20);
    bStack_1b = (byte)(uStack_250 >> 0x28);
    bStack_1a = (byte)(uStack_250 >> 0x30);
    bStack_19 = (byte)(uStack_250 >> 0x38);
    bVar22 = (bStack_14 < bStack_24) * bStack_24 | (bStack_14 >= bStack_24) * bStack_14;
    bVar23 = (bStack_13 < bStack_23) * bStack_23 | (bStack_13 >= bStack_23) * bStack_13;
    bVar24 = (bStack_12 < bStack_22) * bStack_22 | (bStack_12 >= bStack_22) * bStack_12;
    bVar25 = (bStack_11 < bStack_21) * bStack_21 | (bStack_11 >= bStack_21) * bStack_11;
    bVar26 = (bStack_10 < bStack_20) * bStack_20 | (bStack_10 >= bStack_20) * bStack_10;
    bVar27 = (bStack_f < bStack_1f) * bStack_1f | (bStack_f >= bStack_1f) * bStack_f;
    bVar28 = (bStack_e < bStack_1e) * bStack_1e | (bStack_e >= bStack_1e) * bStack_e;
    bVar29 = (bStack_d < bStack_1d) * bStack_1d | (bStack_d >= bStack_1d) * bStack_d;
    bVar30 = (bStack_c < bStack_1c) * bStack_1c | (bStack_c >= bStack_1c) * bStack_c;
    bVar31 = (bStack_b < bStack_1b) * bStack_1b | (bStack_b >= bStack_1b) * bStack_b;
    bVar32 = (bStack_a < bStack_1a) * bStack_1a | (bStack_a >= bStack_1a) * bStack_a;
    bVar33 = (bStack_9 < bStack_19) * bStack_19 | (bStack_9 >= bStack_19) * bStack_9;
    auVar12._8_8_ = in_stack_fffffffffffffcd0;
    auVar12._0_8_ = in_stack_fffffffffffffcc8;
    auVar35._8_8_ = in_stack_fffffffffffffce0;
    auVar35._0_8_ = in_stack_fffffffffffffcd8;
    auVar35 = psubusb(auVar12,auVar35);
    auVar11._8_8_ = in_stack_fffffffffffffce0;
    auVar11._0_8_ = in_stack_fffffffffffffcd8;
    auVar10._8_8_ = in_stack_fffffffffffffcd0;
    auVar10._0_8_ = in_stack_fffffffffffffcc8;
    auVar21 = psubusb(auVar11,auVar10);
    local_278 = auVar35._0_8_;
    local_288 = auVar21._0_8_;
    uStack_280 = auVar21._8_8_;
    local_278 = local_278 | local_288;
    uStack_280 = (ulong)auVar35._8_8_ | uStack_280;
    bStack_44 = (byte)(local_278 >> 0x20);
    bStack_43 = (byte)(local_278 >> 0x28);
    bStack_42 = (byte)(local_278 >> 0x30);
    bStack_41 = (byte)(local_278 >> 0x38);
    bStack_40 = (byte)uStack_280;
    bStack_3f = (byte)(uStack_280 >> 8);
    bStack_3e = (byte)(uStack_280 >> 0x10);
    bStack_3d = (byte)(uStack_280 >> 0x18);
    bStack_3c = (byte)(uStack_280 >> 0x20);
    bStack_3b = (byte)(uStack_280 >> 0x28);
    bStack_3a = (byte)(uStack_280 >> 0x30);
    bStack_39 = (byte)(uStack_280 >> 0x38);
    Load16x4_SSE2(in_stack_fffffffffffffcb8,
                  (uint8_t *)
                  CONCAT17((bVar33 < bStack_39) * bStack_39 | (bVar33 >= bStack_39) * bVar33,
                           CONCAT16((bVar32 < bStack_3a) * bStack_3a |
                                    (bVar32 >= bStack_3a) * bVar32,
                                    CONCAT15((bVar31 < bStack_3b) * bStack_3b |
                                             (bVar31 >= bStack_3b) * bVar31,
                                             CONCAT14((bVar30 < bStack_3c) * bStack_3c |
                                                      (bVar30 >= bStack_3c) * bVar30,
                                                      CONCAT13((bVar29 < bStack_3d) * bStack_3d |
                                                               (bVar29 >= bStack_3d) * bVar29,
                                                               CONCAT12((bVar28 < bStack_3e) *
                                                                        bStack_3e |
                                                                        (bVar28 >= bStack_3e) *
                                                                        bVar28,CONCAT11((bVar27 < 
                                                  bStack_3f) * bStack_3f |
                                                  (bVar27 >= bStack_3f) * bVar27,
                                                  (bVar26 < bStack_40) * bStack_40 |
                                                  (bVar26 >= bStack_40) * bVar26))))))),
                  CONCAT13((bVar25 < bStack_41) * bStack_41 | (bVar25 >= bStack_41) * bVar25,
                           CONCAT12((bVar24 < bStack_42) * bStack_42 |
                                    (bVar24 >= bStack_42) * bVar24,
                                    CONCAT11((bVar23 < bStack_43) * bStack_43 |
                                             (bVar23 >= bStack_43) * bVar23,
                                             (bVar22 < bStack_44) * bStack_44 |
                                             (bVar22 >= bStack_44) * bVar22))),
                  in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                  in_stack_fffffffffffffd48._8_8_);
    auVar9._8_8_ = in_stack_fffffffffffffc90;
    auVar9._0_8_ = local_378;
    auVar8._8_8_ = in_stack_fffffffffffffca0;
    auVar8._0_8_ = in_stack_fffffffffffffc98;
    psubusb(auVar9,auVar8);
    auVar7._8_8_ = in_stack_fffffffffffffca0;
    auVar7._0_8_ = in_stack_fffffffffffffc98;
    auVar6._8_8_ = in_stack_fffffffffffffc90;
    auVar6._0_8_ = local_378;
    psubusb(auVar7,auVar6);
    auVar5._8_8_ = in_stack_fffffffffffffce0;
    auVar5._0_8_ = in_stack_fffffffffffffcd8;
    auVar4._8_8_ = uStack_310;
    auVar4._0_8_ = in_stack_fffffffffffffce8;
    in_stack_fffffffffffffd48 = psubusb(auVar5,auVar4);
    auVar3._8_8_ = uStack_310;
    auVar3._0_8_ = in_stack_fffffffffffffce8;
    auVar2._8_8_ = in_stack_fffffffffffffce0;
    auVar2._0_8_ = in_stack_fffffffffffffcd8;
    psubusb(auVar3,auVar2);
    stride_00 = (int)in_stack_fffffffffffffce0;
    uStack_1fc = (undefined4)((ulong)in_stack_fffffffffffffce0 >> 0x20);
    auVar1._8_8_ = in_stack_fffffffffffffca0;
    auVar1._0_8_ = in_stack_fffffffffffffc98;
    auVar36._8_4_ = stride_00;
    auVar36._0_8_ = in_stack_fffffffffffffcd8;
    auVar36._12_4_ = uStack_1fc;
    auVar36 = psubusb(auVar1,auVar36);
    auVar34._8_8_ = in_stack_fffffffffffffce0;
    auVar34._0_8_ = in_stack_fffffffffffffcd8;
    auVar21._8_8_ = in_stack_fffffffffffffca0;
    auVar21._0_8_ = in_stack_fffffffffffffc98;
    auVar21 = psubusb(auVar34,auVar21);
    ComplexMask_SSE2(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int)in_stack_fffffffffffffcb8,auVar35._8_8_);
    DoFilter4_SSE2(auVar36._0_8_,auVar21._8_8_,auVar21._0_8_,in_RDI,
                   (__m128i *)CONCAT44(in_ESI,in_EDX),in_ECX);
    Store16x4_SSE2(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   in_stack_fffffffffffffcd0,(uint8_t *)in_stack_fffffffffffffcc8,
                   (uint8_t *)in_stack_fffffffffffffcc0,stride_00);
    in_stack_fffffffffffffcb8 = local_378;
    in_stack_fffffffffffffcc0 = in_stack_fffffffffffffc90;
    in_stack_fffffffffffffcc8 = in_stack_fffffffffffffc98;
    in_stack_fffffffffffffcd0 = in_stack_fffffffffffffca0;
  }
  return;
}

Assistant:

static void HFilter16i_SSE2(uint8_t* p, int stride,
                            int thresh, int ithresh, int hev_thresh) {
  int k;
  __m128i p3, p2, p1, p0;   // loop invariants

  Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &p1, &p0);  // prologue

  for (k = 3; k > 0; --k) {
    __m128i mask, tmp1, tmp2;
    uint8_t* const b = p + 2;   // beginning of p1

    p += 4;  // beginning of q0 (and next span)

    MAX_DIFF1(p3, p2, p1, p0, mask);   // compute partial mask
    Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &tmp1, &tmp2);
    MAX_DIFF2(p3, p2, tmp1, tmp2, mask);

    ComplexMask_SSE2(&p1, &p0, &p3, &p2, thresh, ithresh, &mask);
    DoFilter4_SSE2(&p1, &p0, &p3, &p2, &mask, hev_thresh);

    Store16x4_SSE2(&p1, &p0, &p3, &p2, b, b + 8 * stride, stride);

    // rotate samples
    p1 = tmp1;
    p0 = tmp2;
  }
}